

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O1

char * hts_format_description(htsFormat *format)

{
  ushort uVar1;
  htsCompression hVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  ushort uVar8;
  uint uVar9;
  byte *pbVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  char buf [16];
  byte local_48 [24];
  
  switch(format->format) {
  case sam:
    uVar16 = 8;
    pcVar5 = (char *)malloc(8);
    if (pcVar5 == (char *)0x0) break;
    pcVar5[2] = 'M';
    pcVar5[0] = 'S';
    pcVar5[1] = 'A';
LAB_0010d33c:
    pcVar6 = pcVar5 + 3;
    uVar16 = 8;
    uVar15 = 3;
LAB_0010d34f:
    *pcVar6 = '\0';
    goto LAB_0010d35a;
  case bam:
    uVar16 = 8;
    pcVar5 = (char *)malloc(8);
    if (pcVar5 != (char *)0x0) {
      pcVar5[2] = 'M';
LAB_0010d1c6:
      pcVar5[0] = 'B';
      pcVar5[1] = 'A';
      goto LAB_0010d33c;
    }
    break;
  case bai:
    uVar16 = 8;
    pcVar5 = (char *)malloc(8);
    if (pcVar5 != (char *)0x0) {
      pcVar5[2] = 'I';
      goto LAB_0010d1c6;
    }
    break;
  case cram:
    uVar16 = 8;
    pcVar5 = (char *)malloc(8);
    if (pcVar5 != (char *)0x0) {
      builtin_strncpy(pcVar5,"CRAM",4);
LAB_0010d294:
      pcVar6 = pcVar5 + 4;
      uVar16 = 8;
      uVar15 = 4;
      goto LAB_0010d34f;
    }
    break;
  case crai:
    uVar16 = 8;
    pcVar5 = (char *)malloc(8);
    if (pcVar5 != (char *)0x0) {
      builtin_strncpy(pcVar5,"CRAI",4);
      goto LAB_0010d294;
    }
    break;
  case vcf:
    uVar16 = 8;
    pcVar5 = (char *)malloc(8);
    if (pcVar5 != (char *)0x0) {
      pcVar5[2] = 'F';
      pcVar5[0] = 'V';
      pcVar5[1] = 'C';
      goto LAB_0010d33c;
    }
    break;
  case bcf:
    if ((format->version).major == 1) {
      uVar16 = 0x10;
      pcVar5 = (char *)malloc(0x10);
      if (pcVar5 != (char *)0x0) {
        builtin_strncpy(pcVar5,"Legacy BCF",10);
        pcVar6 = pcVar5 + 10;
        uVar16 = 0x10;
        uVar15 = 10;
        goto LAB_0010d34f;
      }
    }
    else {
      uVar16 = 8;
      pcVar5 = (char *)malloc(8);
      if (pcVar5 != (char *)0x0) {
        pcVar5[2] = 'F';
        pcVar5[0] = 'B';
        pcVar5[1] = 'C';
        goto LAB_0010d33c;
      }
    }
    break;
  case csi:
    uVar16 = 8;
    pcVar5 = (char *)malloc(8);
    if (pcVar5 != (char *)0x0) {
      pcVar5[2] = 'I';
      pcVar5[0] = 'C';
      pcVar5[1] = 'S';
      goto LAB_0010d33c;
    }
    break;
  default:
    uVar16 = 0x10;
    pcVar5 = (char *)malloc(0x10);
    if (pcVar5 != (char *)0x0) {
      builtin_strncpy(pcVar5,"unknown",7);
      pcVar6 = pcVar5 + 7;
      uVar16 = 0x10;
      uVar15 = 7;
      goto LAB_0010d34f;
    }
    break;
  case tbi:
    uVar16 = 8;
    pcVar5 = (char *)malloc(8);
    if (pcVar5 != (char *)0x0) {
      builtin_strncpy(pcVar5,"Tabix",5);
      pcVar6 = pcVar5 + 5;
      uVar16 = 8;
      uVar15 = 5;
      goto LAB_0010d34f;
    }
  }
  uVar15 = 0;
  pcVar5 = (char *)0x0;
LAB_0010d35a:
  if (-1 < (format->version).major) {
    uVar13 = uVar15 + 10;
    pcVar6 = pcVar5;
    if (uVar13 < uVar16) {
LAB_0010d39f:
      builtin_strncpy(pcVar6 + uVar15," version ",10);
      uVar15 = uVar15 + 9;
      pcVar5 = pcVar6;
    }
    else {
      uVar16 = (uVar13 >> 4 | (uVar13 >> 1 | uVar13) >> 2 | uVar13 >> 1 | uVar13) + 1;
      pcVar6 = (char *)realloc(pcVar5,uVar16);
      if (pcVar6 != (char *)0x0) goto LAB_0010d39f;
    }
    uVar1 = (format->version).major;
    uVar8 = -uVar1;
    if (0 < (short)uVar1) {
      uVar8 = uVar1;
    }
    uVar13 = 0;
    uVar9 = (uint)uVar8;
    do {
      local_48[uVar13] = (char)uVar9 + (char)(uVar9 / 10) * -10 | 0x30;
      uVar13 = uVar13 + 1;
      bVar3 = 9 < uVar9;
      uVar9 = uVar9 / 10;
    } while (bVar3);
    if ((short)uVar1 < 0) {
      uVar7 = uVar13 & 0xffffffff;
      uVar13 = (ulong)((int)uVar13 + 1);
      local_48[uVar7] = 0x2d;
    }
    iVar14 = (int)uVar13;
    uVar7 = (long)iVar14 + uVar15 + 1;
    pcVar6 = pcVar5;
    if (uVar7 < uVar16) {
LAB_0010d466:
      pcVar5 = pcVar6;
      iVar4 = (int)uVar15;
      iVar12 = 1;
      if (iVar14 < 1) {
        iVar12 = iVar14;
      }
      pbVar10 = local_48 + (uVar13 & 0xffffffff);
      do {
        pbVar10 = pbVar10 + -1;
        pcVar5[uVar15] = *pbVar10;
        uVar15 = uVar15 + 1;
      } while (((iVar4 + iVar14) - iVar12) + 1 != uVar15);
      pcVar5[uVar15] = '\0';
    }
    else {
      uVar7 = uVar7 >> 1 | uVar7;
      uVar7 = uVar7 >> 2 | uVar7;
      uVar7 = uVar7 >> 4 | uVar7;
      uVar7 = uVar7 >> 8 | uVar7;
      uVar16 = (uVar7 >> 0x10 | uVar7) + 1;
      pcVar6 = (char *)realloc(pcVar5,uVar16);
      if (pcVar6 != (char *)0x0) goto LAB_0010d466;
    }
    if (-1 < (format->version).minor) {
      uVar13 = uVar15 + 1;
      pcVar6 = pcVar5;
      if (uVar13 < uVar16) {
LAB_0010d4ff:
        (pcVar6 + uVar15)[0] = '.';
        (pcVar6 + uVar15)[1] = '\0';
        uVar15 = uVar13;
        pcVar5 = pcVar6;
      }
      else {
        uVar16 = uVar13 >> 1 | uVar13;
        uVar16 = uVar16 >> 2 | uVar16;
        uVar16 = uVar16 >> 4 | uVar16;
        uVar16 = uVar16 >> 8 | uVar16;
        uVar16 = (uVar16 >> 0x10 | uVar16) + 1;
        pcVar6 = (char *)realloc(pcVar5,uVar16);
        if (pcVar6 != (char *)0x0) goto LAB_0010d4ff;
      }
      uVar1 = (format->version).minor;
      uVar8 = -uVar1;
      if (0 < (short)uVar1) {
        uVar8 = uVar1;
      }
      uVar13 = 0;
      uVar9 = (uint)uVar8;
      do {
        local_48[uVar13] = (char)uVar9 + (char)(uVar9 / 10) * -10 | 0x30;
        uVar13 = uVar13 + 1;
        bVar3 = 9 < uVar9;
        uVar9 = uVar9 / 10;
      } while (bVar3);
      if ((short)uVar1 < 0) {
        uVar7 = uVar13 & 0xffffffff;
        uVar13 = (ulong)((int)uVar13 + 1);
        local_48[uVar7] = 0x2d;
      }
      uVar7 = (long)(int)uVar13 + uVar15 + 1;
      pcVar6 = pcVar5;
      if (uVar16 <= uVar7) {
        uVar7 = uVar7 >> 1 | uVar7;
        uVar7 = uVar7 >> 2 | uVar7;
        uVar7 = uVar7 >> 4 | uVar7;
        uVar7 = uVar7 >> 8 | uVar7;
        uVar16 = (uVar7 >> 0x10 | uVar7) + 1;
        pcVar6 = (char *)realloc(pcVar5,uVar16);
        if (pcVar6 == (char *)0x0) goto LAB_0010d5e2;
      }
      pcVar5 = pcVar6;
      iVar14 = (int)uVar13 + 1;
      pbVar10 = local_48 + (uVar13 & 0xffffffff);
      do {
        pbVar10 = pbVar10 + -1;
        pcVar5[uVar15] = *pbVar10;
        uVar15 = uVar15 + 1;
        iVar14 = iVar14 + -1;
      } while (1 < iVar14);
      pcVar5[uVar15] = '\0';
    }
  }
LAB_0010d5e2:
  hVar2 = format->compression;
  pcVar6 = pcVar5;
  if (hVar2 == gzip) {
    uVar13 = uVar15 + 0x11;
    if (uVar16 <= uVar13) {
      uVar13 = uVar13 >> 1 | uVar13;
      uVar13 = uVar13 >> 2 | uVar13;
      uVar13 = uVar13 >> 4 | uVar13;
      uVar13 = uVar13 >> 8 | uVar13;
      uVar16 = (uVar13 >> 0x10 | uVar13) + 1;
      pcVar6 = (char *)realloc(pcVar5,uVar16);
      if (pcVar6 == (char *)0x0) goto LAB_0010d6f4;
    }
    uVar17._0_1_ = ' ';
    uVar17._1_1_ = 'g';
    uVar17._2_1_ = 'z';
    uVar17._3_1_ = 'i';
    uVar18._0_1_ = 'p';
    uVar18._1_1_ = '-';
    uVar18._2_1_ = 'c';
    uVar18._3_1_ = 'o';
LAB_0010d6df:
    pcVar5 = pcVar6 + uVar15;
    *(undefined4 *)pcVar5 = uVar17;
    *(undefined4 *)(pcVar5 + 4) = uVar18;
    pcVar5[8] = 'm';
    pcVar5[9] = 'p';
    pcVar5[10] = 'r';
    pcVar5[0xb] = 'e';
    pcVar5[0xc] = 's';
    pcVar5[0xd] = 's';
    pcVar5[0xe] = 'e';
    pcVar5[0xf] = 'd';
    lVar11 = 0x10;
LAB_0010d6e9:
    uVar15 = uVar15 + lVar11;
    pcVar6[uVar15] = '\0';
    pcVar5 = pcVar6;
  }
  else {
    if (hVar2 == bgzf) {
      if ((tbi < format->format) || ((0x1610U >> (format->format & 0x1f) & 1) == 0)) {
        uVar13 = uVar15 + 0x11;
        if (uVar16 <= uVar13) {
          uVar13 = uVar13 >> 1 | uVar13;
          uVar13 = uVar13 >> 2 | uVar13;
          uVar13 = uVar13 >> 4 | uVar13;
          uVar13 = uVar13 >> 8 | uVar13;
          uVar16 = (uVar13 >> 0x10 | uVar13) + 1;
          pcVar6 = (char *)realloc(pcVar5,uVar16);
          if (pcVar6 == (char *)0x0) goto LAB_0010d6f4;
        }
        uVar17._0_1_ = ' ';
        uVar17._1_1_ = 'B';
        uVar17._2_1_ = 'G';
        uVar17._3_1_ = 'Z';
        uVar18._0_1_ = 'F';
        uVar18._1_1_ = '-';
        uVar18._2_1_ = 'c';
        uVar18._3_1_ = 'o';
        goto LAB_0010d6df;
      }
LAB_0010d613:
      uVar13 = uVar15 + 0xc;
      if (uVar16 <= uVar13) {
        uVar13 = uVar13 >> 1 | uVar13;
        uVar13 = uVar13 >> 2 | uVar13;
        uVar13 = uVar13 >> 4 | uVar13;
        uVar13 = uVar13 >> 8 | uVar13;
        uVar16 = (uVar13 >> 0x10 | uVar13) + 1;
        pcVar6 = (char *)realloc(pcVar5,uVar16);
        if (pcVar6 == (char *)0x0) goto LAB_0010d6f4;
      }
      builtin_strncpy(pcVar6 + uVar15," compressed",0xb);
      lVar11 = 0xb;
      goto LAB_0010d6e9;
    }
    if (hVar2 == custom) goto LAB_0010d613;
  }
LAB_0010d6f4:
  pcVar6 = pcVar5;
  switch(format->category) {
  case sequence_data:
    uVar13 = uVar15 + 10;
    if (uVar16 <= uVar13) {
      uVar13 = uVar13 >> 1 | uVar13;
      uVar13 = uVar13 >> 2 | uVar13;
      uVar13 = uVar13 >> 4 | uVar13;
      uVar13 = uVar13 >> 8 | uVar13;
      uVar16 = (uVar13 >> 0x10 | uVar13) + 1;
      pcVar6 = (char *)realloc(pcVar5,uVar16);
      if (pcVar6 == (char *)0x0) goto switchD_0010d70f_default;
    }
    builtin_strncpy(pcVar6 + uVar15," sequence",9);
    lVar11 = 9;
    break;
  case variant_data:
    uVar13 = uVar15 + 0x11;
    if (uVar16 <= uVar13) {
      uVar13 = uVar13 >> 1 | uVar13;
      uVar13 = uVar13 >> 2 | uVar13;
      uVar13 = uVar13 >> 4 | uVar13;
      uVar13 = uVar13 >> 8 | uVar13;
      uVar16 = (uVar13 >> 0x10 | uVar13) + 1;
      pcVar6 = (char *)realloc(pcVar5,uVar16);
      if (pcVar6 == (char *)0x0) goto switchD_0010d70f_default;
    }
    builtin_strncpy(pcVar6 + uVar15," variant calling",0x10);
    lVar11 = 0x10;
    break;
  case index_file:
    uVar13 = uVar15 + 7;
    if (uVar16 <= uVar13) {
      uVar13 = uVar13 >> 1 | uVar13;
      uVar13 = uVar13 >> 2 | uVar13;
      uVar13 = uVar13 >> 4 | uVar13;
      uVar13 = uVar13 >> 8 | uVar13;
      uVar16 = (uVar13 >> 0x10 | uVar13) + 1;
      pcVar6 = (char *)realloc(pcVar5,uVar16);
      if (pcVar6 == (char *)0x0) goto switchD_0010d70f_default;
    }
    builtin_strncpy(pcVar6 + uVar15," index",6);
    lVar11 = 6;
    break;
  case region_list:
    uVar13 = uVar15 + 0x10;
    if (uVar16 <= uVar13) {
      uVar13 = uVar13 >> 1 | uVar13;
      uVar13 = uVar13 >> 2 | uVar13;
      uVar13 = uVar13 >> 4 | uVar13;
      uVar13 = uVar13 >> 8 | uVar13;
      uVar16 = (uVar13 >> 0x10 | uVar13) + 1;
      pcVar6 = (char *)realloc(pcVar5,uVar16);
      if (pcVar6 == (char *)0x0) goto switchD_0010d70f_default;
    }
    builtin_strncpy(pcVar6 + uVar15," genomic region",0xf);
    lVar11 = 0xf;
    break;
  default:
    goto switchD_0010d70f_default;
  }
  uVar15 = uVar15 + lVar11;
  pcVar6[uVar15] = '\0';
  pcVar5 = pcVar6;
switchD_0010d70f_default:
  pcVar6 = pcVar5;
  if (((format->compression == no_compression) && (format->format < (tbi|text_format))) &&
     ((0x2188U >> (format->format & 0x1f) & 1) != 0)) {
    uVar13 = uVar15 + 6;
    if ((uVar16 <= uVar13) &&
       (uVar13 = uVar13 >> 1 | uVar13, uVar13 = uVar13 >> 2 | uVar13, uVar13 = uVar13 >> 4 | uVar13,
       uVar13 = uVar13 >> 8 | uVar13, pcVar6 = (char *)realloc(pcVar5,(uVar13 >> 0x10 | uVar13) + 1)
       , pcVar6 == (char *)0x0)) {
      return pcVar5;
    }
    builtin_strncpy(pcVar6 + uVar15," text",5);
  }
  else {
    uVar13 = uVar15 + 6;
    if ((uVar16 <= uVar13) &&
       (uVar13 = uVar13 >> 1 | uVar13, uVar13 = uVar13 >> 2 | uVar13, uVar13 = uVar13 >> 4 | uVar13,
       uVar13 = uVar13 >> 8 | uVar13, pcVar6 = (char *)realloc(pcVar5,(uVar13 >> 0x10 | uVar13) + 1)
       , pcVar6 == (char *)0x0)) {
      return pcVar5;
    }
    builtin_strncpy(pcVar6 + uVar15," data",5);
  }
  pcVar6[uVar15 + 5] = '\0';
  return pcVar6;
}

Assistant:

char *hts_format_description(const htsFormat *format)
{
    kstring_t str = { 0, 0, NULL };

    switch (format->format) {
    case sam:   kputs("SAM", &str); break;
    case bam:   kputs("BAM", &str); break;
    case cram:  kputs("CRAM", &str); break;
    case vcf:   kputs("VCF", &str); break;
    case bcf:
        if (format->version.major == 1) kputs("Legacy BCF", &str);
        else kputs("BCF", &str);
        break;
    case bai:   kputs("BAI", &str); break;
    case crai:  kputs("CRAI", &str); break;
    case csi:   kputs("CSI", &str); break;
    case tbi:   kputs("Tabix", &str); break;
    default:    kputs("unknown", &str); break;
    }

    if (format->version.major >= 0) {
        kputs(" version ", &str);
        kputw(format->version.major, &str);
        if (format->version.minor >= 0) {
            kputc('.', &str);
            kputw(format->version.minor, &str);
        }
    }

    switch (format->compression) {
    case custom: kputs(" compressed", &str); break;
    case gzip:   kputs(" gzip-compressed", &str); break;
    case bgzf:
        switch (format->format) {
        case bam:
        case bcf:
        case csi:
        case tbi:
            // These are by definition BGZF, so just use the generic term
            kputs(" compressed", &str);
            break;
        default:
            kputs(" BGZF-compressed", &str);
            break;
        }
        break;
    default: break;
    }

    switch (format->category) {
    case sequence_data: kputs(" sequence", &str); break;
    case variant_data:  kputs(" variant calling", &str); break;
    case index_file:    kputs(" index", &str); break;
    case region_list:   kputs(" genomic region", &str); break;
    default: break;
    }

    if (format->compression == no_compression)
        switch (format->format) {
        case sam:
        case crai:
        case vcf:
        case bed:
            kputs(" text", &str);
            break;

        default:
            kputs(" data", &str);
            break;
        }
    else
        kputs(" data", &str);

    return ks_release(&str);
}